

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

void __thiscall
spvtools::opt::VectorDCE::FindLiveComponents
          (VectorDCE *this,Function *function,LiveComponentMap *live_components)

{
  Instruction *current_inst;
  bool bVar1;
  BitVector *live_elements;
  uint uVar2;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  work_list;
  WorkListItem current_item;
  WorkListItem local_50;
  
  work_list.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  work_list.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  work_list.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  current_item.components.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  current_item.instruction = (Instruction *)operator_new(0x18);
  ((current_item.instruction)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)&work_list;
  ((current_item.instruction)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
       (Instruction *)this;
  ((current_item.instruction)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
       (Instruction *)live_components;
  current_item.components.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/vector_dce.cpp:52:7)>
                ::_M_invoke;
  current_item.components.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/vector_dce.cpp:52:7)>
                ::_M_manager;
  uVar2 = 0;
  Function::ForEachInst
            (function,(function<void_(spvtools::opt::Instruction_*)> *)&current_item,false,false);
  if (current_item.components.bits_.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)current_item.components.bits_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish)(&current_item,&current_item,3);
  }
  for (; (ulong)uVar2 <
         (ulong)((long)work_list.
                       super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)work_list.
                       super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    WorkListItem::WorkListItem
              (&current_item,
               work_list.
               super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar2);
    current_inst = current_item.instruction;
    switch((current_item.instruction)->opcode_) {
    case OpVectorShuffle:
      MarkVectorShuffleUsesAsLive(this,&current_item,live_components,&work_list);
      break;
    case OpCompositeConstruct:
      WorkListItem::WorkListItem(&local_50,&current_item);
      MarkCompositeContructUsesAsLive(this,&local_50,live_components,&work_list);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50.components
                );
      break;
    case OpCompositeExtract:
      MarkExtractUseAsLive
                (this,current_item.instruction,&current_item.components,live_components,&work_list);
      break;
    case OpCompositeInsert:
      MarkInsertUsesAsLive(this,&current_item,live_components,&work_list);
      break;
    default:
      bVar1 = Instruction::IsScalarizable(current_item.instruction);
      live_elements = &this->all_components_live_;
      if (bVar1) {
        live_elements = &current_item.components;
      }
      MarkUsesAsLive(this,current_inst,live_elements,live_components,&work_list);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &current_item.components);
  }
  std::
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ::~vector(&work_list);
  return;
}

Assistant:

void VectorDCE::FindLiveComponents(Function* function,
                                   LiveComponentMap* live_components) {
  std::vector<WorkListItem> work_list;

  // Prime the work list.  We will assume that any instruction that does
  // not result in a vector is live.
  //
  // Extending to structures and matrices is not as straight forward because of
  // the nesting.  We cannot simply us a bit vector to keep track of which
  // components are live because of arbitrary nesting of structs.
  function->ForEachInst(
      [&work_list, this, live_components](Instruction* current_inst) {
        if (current_inst->IsCommonDebugInstr()) {
          return;
        }
        if (!HasVectorOrScalarResult(current_inst) ||
            !context()->IsCombinatorInstruction(current_inst)) {
          MarkUsesAsLive(current_inst, all_components_live_, live_components,
                         &work_list);
        }
      });

  // Process the work list propagating liveness.
  for (uint32_t i = 0; i < work_list.size(); i++) {
    WorkListItem current_item = work_list[i];
    Instruction* current_inst = current_item.instruction;

    switch (current_inst->opcode()) {
      case spv::Op::OpCompositeExtract:
        MarkExtractUseAsLive(current_inst, current_item.components,
                             live_components, &work_list);
        break;
      case spv::Op::OpCompositeInsert:
        MarkInsertUsesAsLive(current_item, live_components, &work_list);
        break;
      case spv::Op::OpVectorShuffle:
        MarkVectorShuffleUsesAsLive(current_item, live_components, &work_list);
        break;
      case spv::Op::OpCompositeConstruct:
        MarkCompositeContructUsesAsLive(current_item, live_components,
                                        &work_list);
        break;
      default:
        if (current_inst->IsScalarizable()) {
          MarkUsesAsLive(current_inst, current_item.components, live_components,
                         &work_list);
        } else {
          MarkUsesAsLive(current_inst, all_components_live_, live_components,
                         &work_list);
        }
        break;
    }
  }
}